

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

void __thiscall
google::protobuf::TextFormat::FastFieldValuePrinter::PrintFieldName
          (FastFieldValuePrinter *this,Message *message,Reflection *reflection,
          FieldDescriptor *field,BaseTextGenerator *generator)

{
  string *psVar1;
  Descriptor *pDVar2;
  undefined8 *puVar3;
  FieldDescriptor *local_20;
  _func_void_FieldDescriptor_ptr *local_18;
  
  if (field[0x42] == (FieldDescriptor)0x1) {
    (*generator->_vptr_BaseTextGenerator[5])(generator,"[",1);
    psVar1 = FieldDescriptor::PrintableNameForExtension_abi_cxx11_(field);
    (*generator->_vptr_BaseTextGenerator[5])
              (generator,(psVar1->_M_dataplus)._M_p,psVar1->_M_string_length);
    (*generator->_vptr_BaseTextGenerator[5])(generator,"]",1);
    return;
  }
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_18 = FieldDescriptor::TypeOnceInit;
    local_20 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),&local_18,&local_20);
  }
  if (*(int *)(field + 0x38) == 10) {
    pDVar2 = FieldDescriptor::message_type(field);
    puVar3 = *(undefined8 **)pDVar2;
  }
  else {
    puVar3 = *(undefined8 **)field;
  }
  (*generator->_vptr_BaseTextGenerator[5])(generator,*puVar3,puVar3[1]);
  return;
}

Assistant:

void TextFormat::FastFieldValuePrinter::PrintFieldName(
    const Message& message, const Reflection* reflection,
    const FieldDescriptor* field, BaseTextGenerator* generator) const {
  if (field->is_extension()) {
    generator->PrintLiteral("[");
    generator->PrintString(field->PrintableNameForExtension());
    generator->PrintLiteral("]");
  } else if (field->type() == FieldDescriptor::TYPE_GROUP) {
    // Groups must be serialized with their original capitalization.
    generator->PrintString(field->message_type()->name());
  } else {
    generator->PrintString(field->name());
  }
}